

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O0

Geodesic * Geodesic::getGeodesicNoCommonEdges(PhyloTree *t1,PhyloTree *t2)

{
  bool bVar1;
  undefined8 uVar2;
  ulong uVar3;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *this;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  PhyloTreeEdge *pPVar7;
  reference puVar8;
  long in_RDX;
  long in_RSI;
  Geodesic *in_RDI;
  unsigned_long bVertex;
  iterator __end3_1;
  iterator __begin3_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_1;
  unsigned_long aVertex;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  int j;
  Ratio r2;
  Ratio r1;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  cover;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  index_iter_1;
  int i;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  index_iter;
  PhyloTreeEdge *ratio_e_edge;
  iterator __end2;
  iterator __begin2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> ratio_f_edges;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> ratio_e_edges;
  BipartiteGraph bg;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  incidenceMatrix;
  Ratio ratio;
  deque<Ratio,_std::allocator<Ratio>_> queue;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bVertices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> aVertices;
  RatioSequence rs;
  size_t numEdges2;
  size_t numEdges1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges;
  Ratio *in_stack_fffffffffffffaf8;
  BipartiteGraph *in_stack_fffffffffffffb00;
  BipartiteGraph *pBVar9;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffb08;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffb10;
  PhyloTreeEdge *in_stack_fffffffffffffb18;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffb20;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb38;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_fffffffffffffb48;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffb50;
  PhyloTree *in_stack_fffffffffffffb58;
  Geodesic *Aweight;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  *in_stack_fffffffffffffb88;
  BipartiteGraph *__n;
  BipartiteGraph *in_stack_fffffffffffffb90;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_468;
  undefined1 *local_460;
  PhyloTreeEdge *local_458;
  unsigned_long *local_450;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_448;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  int iVar10;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_3b0;
  PhyloTreeEdge *local_398;
  PhyloTreeEdge *local_390;
  PhyloTreeEdge *local_388;
  PhyloTreeEdge *local_380;
  PhyloTreeEdge *local_378;
  PhyloTreeEdge *local_370;
  int local_364;
  PhyloTreeEdge *local_360;
  PhyloTreeEdge *local_358;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_350;
  PhyloTreeEdge *local_348;
  PhyloTreeEdge *local_340;
  PhyloTreeEdge *local_338;
  reference local_330;
  PhyloTreeEdge *local_328;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_320;
  undefined1 *local_318;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_310;
  undefined1 local_2f8 [192];
  Ratio local_238 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe50;
  BipartiteGraph *in_stack_fffffffffffffe58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_190;
  undefined4 local_174;
  PhyloTreeEdge *local_110;
  PhyloTreeEdge *local_108;
  PhyloTreeEdge *local_100;
  PhyloTreeEdge *local_f8;
  undefined1 local_e9;
  size_type local_38;
  size_type local_30;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_28;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_20;
  
  local_20 = (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x20);
  local_28 = (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RDX + 0x20);
  Aweight = in_RDI;
  local_30 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(local_20);
  local_38 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(local_28);
  if ((local_30 == 0) && (local_38 == 0)) {
    RatioSequence::RatioSequence((RatioSequence *)0x1603ec);
    Geodesic((Geodesic *)in_stack_fffffffffffffb20._M_current,
             (RatioSequence *)in_stack_fffffffffffffb18);
    RatioSequence::~RatioSequence((RatioSequence *)0x16040d);
  }
  else {
    if ((local_30 == 0) || (local_38 == 0)) {
      local_e9 = 1;
      uVar2 = __cxa_allocate_exception(0x20);
      PhyloTree::getNewick_abi_cxx11_
                ((PhyloTree *)r1.eLength,
                 r2.fEdges.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._7_1_);
      std::operator+((char *)in_stack_fffffffffffffb08._M_current,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb08._M_current,(char *)in_stack_fffffffffffffb00);
      PhyloTree::getNewick_abi_cxx11_
                ((PhyloTree *)r1.eLength,
                 r2.fEdges.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._7_1_);
      std::operator+(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
      local_e9 = 0;
      __cxa_throw(uVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    local_f8 = (PhyloTreeEdge *)
               std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                         ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                          in_stack_fffffffffffffaf8);
    local_100 = (PhyloTreeEdge *)
                std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                          ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                           in_stack_fffffffffffffaf8);
    std::
    sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    local_108 = (PhyloTreeEdge *)
                std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                          ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                           in_stack_fffffffffffffaf8);
    local_110 = (PhyloTreeEdge *)
                std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                          ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                           in_stack_fffffffffffffaf8);
    std::
    sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    RatioSequence::RatioSequence((RatioSequence *)0x160667);
    if ((local_30 == 1) || (local_38 == 1)) {
      Ratio::Ratio((Ratio *)in_stack_fffffffffffffb20._M_current,
                   (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                   in_stack_fffffffffffffb18,
                   (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                   in_stack_fffffffffffffb10._M_current);
      RatioSequence::push_back_value
                ((RatioSequence *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      Ratio::~Ratio((Ratio *)in_stack_fffffffffffffb00);
      Geodesic((Geodesic *)in_stack_fffffffffffffb20._M_current,
               (RatioSequence *)in_stack_fffffffffffffb18);
      local_174 = 1;
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x160737);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x160744);
      std::deque<Ratio,_std::allocator<Ratio>_>::deque
                ((deque<Ratio,_std::allocator<Ratio>_> *)0x160751);
      Ratio::Ratio((Ratio *)in_stack_fffffffffffffb00);
      BipartiteGraph::getIncidenceMatrix
                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                 CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 in_stack_fffffffffffffbc0);
      PhyloTree::getIntEdgeAttribNorms(in_stack_fffffffffffffb58);
      PhyloTree::getIntEdgeAttribNorms(in_stack_fffffffffffffb58);
      BipartiteGraph::BipartiteGraph
                (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                 (vector<double,_std::allocator<double>_> *)Aweight,
                 (vector<double,_std::allocator<double>_> *)in_RDI);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb10._M_current);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb10._M_current);
      std::deque<Ratio,std::allocator<Ratio>>::
      emplace_back<std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>&,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>&>
                ((deque<Ratio,_std::allocator<Ratio>_> *)in_stack_fffffffffffffb10._M_current,
                 (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                 in_stack_fffffffffffffb08._M_current,
                 (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffb00)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb30,
                 (size_type)in_stack_fffffffffffffb28._M_current);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb30,
                 (size_type)in_stack_fffffffffffffb28._M_current);
      while( true ) {
        bVar1 = std::deque<Ratio,_std::allocator<Ratio>_>::empty
                          ((deque<Ratio,_std::allocator<Ratio>_> *)0x16084c);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        std::deque<Ratio,_std::allocator<Ratio>_>::front
                  ((deque<Ratio,_std::allocator<Ratio>_> *)in_stack_fffffffffffffb10._M_current);
        Ratio::operator=((Ratio *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
        std::deque<Ratio,_std::allocator<Ratio>_>::pop_front
                  ((deque<Ratio,_std::allocator<Ratio>_> *)in_stack_fffffffffffffb00);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x160890);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16089d);
        Ratio::getEEdges(local_238);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
                  ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                   in_stack_fffffffffffffb50._M_current,in_stack_fffffffffffffb48);
        Ratio::getFEdges(local_238);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
                  ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                   in_stack_fffffffffffffb50._M_current,in_stack_fffffffffffffb48);
        local_318 = local_2f8;
        local_320._M_current =
             (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffaf8);
        local_328 = (PhyloTreeEdge *)
                    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                               in_stack_fffffffffffffaf8);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                              *)in_stack_fffffffffffffb00,
                             (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                              *)in_stack_fffffffffffffaf8);
          if (!bVar1) break;
          local_330 = __gnu_cxx::
                      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                      ::operator*(&local_320);
          local_340 = (PhyloTreeEdge *)
                      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                 in_stack_fffffffffffffaf8);
          local_348 = (PhyloTreeEdge *)
                      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                 in_stack_fffffffffffffaf8);
          in_stack_fffffffffffffb50 =
               std::
               lower_bound<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,PhyloTreeEdge>
                         (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                          in_stack_fffffffffffffb18);
          local_338 = in_stack_fffffffffffffb50._M_current;
          local_358 = (PhyloTreeEdge *)
                      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                 in_stack_fffffffffffffaf8);
          local_360 = local_338;
          in_stack_fffffffffffffb48 =
               (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
               std::
               distance<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
                         (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
          local_350 = in_stack_fffffffffffffb48;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffb00,(value_type_conflict1 *)in_stack_fffffffffffffaf8);
          __gnu_cxx::
          __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
          ::operator++(&local_320);
        }
        local_364 = 0;
        while( true ) {
          uVar3 = (ulong)local_364;
          this = Ratio::getFEdges(local_238);
          sVar4 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(this);
          if (sVar4 <= uVar3) break;
          local_378 = (PhyloTreeEdge *)
                      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                 in_stack_fffffffffffffaf8);
          local_380 = (PhyloTreeEdge *)
                      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                 in_stack_fffffffffffffaf8);
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                    (&local_310,(long)local_364);
          local_370 = (PhyloTreeEdge *)
                      std::
                      lower_bound<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,PhyloTreeEdge>
                                (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                                 in_stack_fffffffffffffb18);
          local_390 = (PhyloTreeEdge *)
                      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                 in_stack_fffffffffffffaf8);
          local_398 = local_370;
          in_stack_fffffffffffffb28._M_current =
               (PhyloTreeEdge *)
               std::
               distance<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
                         (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
          local_388 = in_stack_fffffffffffffb28._M_current;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffb00,(value_type_conflict1 *)in_stack_fffffffffffffaf8);
          local_364 = local_364 + 1;
        }
        BipartiteGraph::vertex_cover
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        pvVar5 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](&local_3b0,0);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar5,0);
        if (*pvVar6 == 0) {
LAB_00160cde:
          RatioSequence::push_back
                    ((RatioSequence *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
        }
        else {
          pvVar5 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](&local_3b0,0);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar5,0);
          in_stack_fffffffffffffb20._M_current = (PhyloTreeEdge *)*pvVar6;
          pPVar7 = (PhyloTreeEdge *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_190);
          if (in_stack_fffffffffffffb20._M_current == pPVar7) goto LAB_00160cde;
          Ratio::Ratio((Ratio *)in_stack_fffffffffffffb00);
          Ratio::Ratio((Ratio *)in_stack_fffffffffffffb00);
          iVar10 = 0;
          local_448._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffaf8);
          local_450 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffffaf8);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_fffffffffffffb00,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_fffffffffffffaf8);
            if (!bVar1) break;
            puVar8 = __gnu_cxx::
                     __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ::operator*(&local_448);
            local_458 = (PhyloTreeEdge *)*puVar8;
            in_stack_fffffffffffffb18 = (PhyloTreeEdge *)(long)iVar10;
            pvVar5 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::operator[](&local_3b0,2);
            pPVar7 = (PhyloTreeEdge *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar5);
            if (in_stack_fffffffffffffb18 < pPVar7) {
              in_stack_fffffffffffffb10._M_current = local_458;
              pvVar5 = std::
                       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::operator[](&local_3b0,2);
              pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (pvVar5,(long)iVar10);
              if (in_stack_fffffffffffffb10._M_current != (PhyloTreeEdge *)*pvVar6)
              goto LAB_00160e99;
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                        (local_20,(size_type)local_458);
              Ratio::addEEdge((Ratio *)in_stack_fffffffffffffb10._M_current,
                              in_stack_fffffffffffffb08._M_current);
              iVar10 = iVar10 + 1;
            }
            else {
LAB_00160e99:
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                        (local_20,(size_type)local_458);
              Ratio::addEEdge((Ratio *)in_stack_fffffffffffffb10._M_current,
                              in_stack_fffffffffffffb08._M_current);
            }
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&local_448);
          }
          iVar10 = 0;
          local_460 = &stack0xfffffffffffffe58;
          local_468._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffaf8);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffaf8);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_fffffffffffffb00,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_fffffffffffffaf8);
            if (!bVar1) break;
            puVar8 = __gnu_cxx::
                     __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ::operator*(&local_468);
            pBVar9 = (BipartiteGraph *)*puVar8;
            in_stack_fffffffffffffb08._M_current = (PhyloTreeEdge *)(long)iVar10;
            pvVar5 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::operator[](&local_3b0,3);
            pPVar7 = (PhyloTreeEdge *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar5);
            __n = pBVar9;
            if (in_stack_fffffffffffffb08._M_current < pPVar7) {
              pvVar5 = std::
                       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::operator[](&local_3b0,3);
              pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (pvVar5,(long)iVar10);
              in_stack_fffffffffffffb00 = pBVar9;
              if (pBVar9 != (BipartiteGraph *)*pvVar6) goto LAB_00160ffb;
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                        (local_28,(size_type)__n);
              Ratio::addFEdge((Ratio *)in_stack_fffffffffffffb10._M_current,
                              in_stack_fffffffffffffb08._M_current);
              iVar10 = iVar10 + 1;
            }
            else {
LAB_00160ffb:
              pBVar9 = in_stack_fffffffffffffb00;
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                        (local_28,(size_type)__n);
              Ratio::addFEdge((Ratio *)in_stack_fffffffffffffb10._M_current,
                              in_stack_fffffffffffffb08._M_current);
            }
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&local_468);
            in_stack_fffffffffffffb00 = pBVar9;
          }
          std::deque<Ratio,_std::allocator<Ratio>_>::push_front
                    ((deque<Ratio,_std::allocator<Ratio>_> *)in_stack_fffffffffffffb00,
                     in_stack_fffffffffffffaf8);
          std::deque<Ratio,_std::allocator<Ratio>_>::push_front
                    ((deque<Ratio,_std::allocator<Ratio>_> *)in_stack_fffffffffffffb00,
                     in_stack_fffffffffffffaf8);
          Ratio::~Ratio((Ratio *)in_stack_fffffffffffffb00);
          Ratio::~Ratio((Ratio *)in_stack_fffffffffffffb00);
        }
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)in_stack_fffffffffffffb10._M_current);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
                  ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                   in_stack_fffffffffffffb10._M_current);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
                  ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                   in_stack_fffffffffffffb10._M_current);
      }
      Geodesic((Geodesic *)in_stack_fffffffffffffb20._M_current,
               (RatioSequence *)in_stack_fffffffffffffb18);
      local_174 = 1;
      BipartiteGraph::~BipartiteGraph(in_stack_fffffffffffffb00);
      std::
      vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
      ::~vector((vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
                 *)in_stack_fffffffffffffb10._M_current);
      Ratio::~Ratio((Ratio *)in_stack_fffffffffffffb00);
      std::deque<Ratio,_std::allocator<Ratio>_>::~deque
                ((deque<Ratio,_std::allocator<Ratio>_> *)in_stack_fffffffffffffb50._M_current);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffb10._M_current);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffb10._M_current);
    }
    RatioSequence::~RatioSequence((RatioSequence *)0x1611b5);
  }
  return Aweight;
}

Assistant:

Geodesic Geodesic::getGeodesicNoCommonEdges(PhyloTree &t1, PhyloTree &t2) {
    auto& t1_edges = t1.edges;
    auto& t2_edges = t2.edges;
    size_t numEdges1 = t1_edges.size(); // number of edges in tree 1
    size_t numEdges2 = t2_edges.size(); // number of edges in tree 2

    if (numEdges1 == 0 && numEdges2 == 0)
        return Geodesic(RatioSequence());

    // double-check that both trees have splits.  Otherwise didn't remove a common edge.
    if (numEdges1 == 0 || numEdges2 == 0) {
        throw ("Error: tried to compute geodesic between subtrees that should not have common/compatible edges, but do!  t1 = " + t1.getNewick(true) + " and t2 = " + t2.getNewick(true));
    }

    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    // double-check no common edges
//    vector<PhyloTreeEdge> commonEdges;
//    PhyloTree::getCommonEdges(t1_edges, t2_edges, commonEdges);
//    if (commonEdges.size() != 0) {
//        throw invalid_argument("Error: tried to compute geodesic between subtrees that should not have common edges, but do!  t1 = " + t1.getNewick(true) + " and t2 = " + t2.getNewick(true));
//    }

    auto rs = RatioSequence();
    // if we can't split the ratio because it has too few edges in either the numerator or denominator
    if ((numEdges1 == 1) || (numEdges2 == 1)) {
        rs.push_back_value(Ratio(t1_edges, t2_edges));
        return Geodesic(rs);
    }

    vector<size_t> aVertices, bVertices;
    deque<Ratio> queue;
    Ratio ratio;

    // initialize BipartiteGraph
    auto incidenceMatrix = BipartiteGraph::getIncidenceMatrix(t1_edges, t2_edges);
    BipartiteGraph bg(incidenceMatrix, t1.getIntEdgeAttribNorms(), t2.getIntEdgeAttribNorms());
    queue.emplace_back(t1_edges, t2_edges);
    aVertices.reserve(numEdges1);
    bVertices.reserve(numEdges2);

    while (!queue.empty()) {
        ratio = queue.front();
        queue.pop_front();
        aVertices.clear();
        bVertices.clear();

        // convert the ratio to what we pass to vertex cover
        auto ratio_e_edges = ratio.getEEdges();
        auto ratio_f_edges = ratio.getFEdges();
        for (const auto & ratio_e_edge : ratio_e_edges) {
            auto index_iter = std::lower_bound(t1_edges.begin(), t1_edges.end(), ratio_e_edge);
            aVertices.push_back(std::distance(t1_edges.begin(), index_iter));
        }

        for (int i = 0; i < ratio.getFEdges().size(); i++) {
            auto index_iter = std::lower_bound(t2_edges.begin(), t2_edges.end(), ratio_f_edges[i]);
            bVertices.push_back(std::distance(t2_edges.begin(), index_iter));
        }

        // get the cover
        auto cover = bg.vertex_cover(aVertices, bVertices);
        // check if cover is trivial
        if ((cover[0][0] == 0) || (cover[0][0] == aVertices.size())) {
            // add ratio to geodesic
            rs.push_back(ratio);


        } else {  // cover not trivial
            // make two new ratios
            auto r1 = Ratio();
            auto r2 = Ratio();

            int j = 0;  // for index in cover array

            // split the ratio based on the cover
            for (unsigned long aVertex : aVertices) {
                if ((j < cover[2].size()) && (aVertex == cover[2][j])) {
                    r1.addEEdge(t1_edges[aVertex]);
                    j++;
                } else { // the split is not in the cover, and hence dropped first
                    r2.addEEdge(t1_edges[aVertex]);
                }
            }

            j = 0;   // reset index
            // split the ratio based on the cover
            for (unsigned long bVertex : bVertices) {
                if ((j < cover[3].size()) && (bVertex == cover[3][j])) {
                    r2.addFEdge(t2_edges[bVertex]);
                    j++;
                } else { // the split is not in the cover, and hence dropped first
                    r1.addFEdge(t2_edges[bVertex]);
                }
            }

            // add ratios to the queue
            queue.push_front(r2);
            queue.push_front(r1);
        }
    }
    return Geodesic(rs);
}